

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_1::ComparisonOpsGroup::init
          (ComparisonOpsGroup *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  RandomShaderCase *pRVar1;
  ulong uVar2;
  deUint32 local_9c;
  int seed;
  TestCaseGroup *fragmentGroup;
  TestCaseGroup *vertexGroup;
  ProgramParameters params;
  ComparisonOpsGroup *this_local;
  
  params._96_8_ = this;
  rsg::ProgramParameters::ProgramParameters((ProgramParameters *)&vertexGroup);
  params.fragmentParameters.maxSamplers._1_1_ = 1;
  params.fragmentParameters.maxSamplers._3_1_ = 1;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  local_9c = 0;
  uVar2 = extraout_RAX;
  while ((int)local_9c < 0x32) {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,
                        "Comparison operators in vertex shader",(ProgramParameters *)&vertexGroup,
                        local_9c,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar1);
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,
                        "Comparison operators in fragment shader",(ProgramParameters *)&vertexGroup,
                        local_9c,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar1);
    local_9c = local_9c + 1;
    uVar2 = (ulong)local_9c;
  }
  return (int)uVar2;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions = true;
		params.useComparisonOps		= true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		for (int seed = 0; seed < 50; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Comparison operators in vertex shader",		params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Comparison operators in fragment shader",		params, seed, false, true));
		}
	}